

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_scaling_operations.c
# Opt level: O0

int WebRtcSpl_ScaleAndAddVectorsWithRoundC
              (int16_t *in_vector1,int16_t in_vector1_scale,int16_t *in_vector2,
              int16_t in_vector2_scale,int right_shifts,int16_t *out_vector,size_t length)

{
  ulong uStack_40;
  int round_value;
  size_t i;
  int16_t *out_vector_local;
  int right_shifts_local;
  int16_t in_vector2_scale_local;
  int16_t *in_vector2_local;
  int16_t in_vector1_scale_local;
  int16_t *in_vector1_local;
  
  if ((((in_vector1 == (int16_t *)0x0) || (in_vector2 == (int16_t *)0x0)) ||
      (out_vector == (int16_t *)0x0)) || ((length == 0 || (right_shifts < 0)))) {
    in_vector1_local._4_4_ = -1;
  }
  else {
    for (uStack_40 = 0; uStack_40 < length; uStack_40 = uStack_40 + 1) {
      out_vector[uStack_40] =
           (int16_t)((int)in_vector1[uStack_40] * (int)in_vector1_scale +
                     (int)in_vector2[uStack_40] * (int)in_vector2_scale +
                     ((1 << ((byte)right_shifts & 0x1f)) >> 1) >> ((byte)right_shifts & 0x1f));
    }
    in_vector1_local._4_4_ = 0;
  }
  return in_vector1_local._4_4_;
}

Assistant:

int WebRtcSpl_ScaleAndAddVectorsWithRoundC(const int16_t* in_vector1,
                                           int16_t in_vector1_scale,
                                           const int16_t* in_vector2,
                                           int16_t in_vector2_scale,
                                           int right_shifts,
                                           int16_t* out_vector,
                                           size_t length) {
  size_t i = 0;
  int round_value = (1 << right_shifts) >> 1;

  if (in_vector1 == NULL || in_vector2 == NULL || out_vector == NULL ||
      length == 0 || right_shifts < 0) {
    return -1;
  }

  for (i = 0; i < length; i++) {
    out_vector[i] = (int16_t)((
        in_vector1[i] * in_vector1_scale + in_vector2[i] * in_vector2_scale +
        round_value) >> right_shifts);
  }

  return 0;
}